

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O0

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateResult<mp::QuadAndLinTerms,0>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *con,double lb,double ub,Context ctx)

{
  bool bVar1;
  FunctionalConstraint *in_RSI;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_RDI;
  double in_XMM0_Qa;
  NodeRange NVar2;
  FunctionalConstraint *in_stack_fffffffffffffda8;
  int v;
  undefined8 in_stack_fffffffffffffdb0;
  Context c;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffdb8;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_fffffffffffffde0;
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffde8;
  undefined1 local_210 [4];
  Context in_stack_fffffffffffffdf4;
  double in_stack_fffffffffffffe58;
  double in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffffe70;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_stack_ffffffffffffffb8;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffffc0;
  Context local_4;
  
  c.value_ = (CtxVal)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  FunctionalConstraint::GetResultVar(in_RSI);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::NarrowVarBounds(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
                    in_stack_fffffffffffffe58);
  FunctionalConstraint::AddContext(in_stack_fffffffffffffda8,c);
  if ((in_XMM0_Qa <= 0.0) || (bVar1 = Context::HasPositive(&local_4), !bVar1)) {
    ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
    GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                   *)0x26547e);
    PropagateResult<mp::QuadAndLinTerms,mp::AlgConRhs<0>>
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdf4);
  }
  else {
    ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
    GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                   *)0x2653f3);
    v = (int)((ulong)local_210 >> 0x20);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
              (in_RDI,in_stack_fffffffffffffdb8);
    NVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
            ::AddConstraint_AS_ROOT<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
                      (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint
              ((AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *)NVar2.ir_);
    FunctionalConstraint::GetResultVar(in_RSI);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::DecrementVarUsage((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)NVar2.ir_,v);
  }
  return;
}

Assistant:

void PropagateResult(
      ConditionalConstraint<
        AlgebraicConstraint< Body, AlgConRhs<kind> > >& con,
      double lb, double ub, Context ctx) {
    MPD( NarrowVarBounds(con.GetResultVar(), lb, ub) );
    con.AddContext(ctx);
    if (lb>0 && ctx.HasPositive()) {              // Is true
      if constexpr (kind*kind<=1) {               // == or <= or >=
        MPD(AddConstraint_AS_ROOT(con.GetConstraint()));
        MPD( DecrementVarUsage(con.GetResultVar()) );
      }
    } else {
      MPD( PropagateResult(con.GetConstraint(), ctx) );
    }
  }